

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_geom.c
# Opt level: O0

REF_STATUS ref_geom_constrain(REF_GRID ref_grid,REF_INT node)

{
  int iVar1;
  REF_NODE pRVar2;
  REF_GEOM ref_geom_00;
  REF_ADJ pRVar3;
  bool bVar4;
  REF_INT local_b4;
  REF_INT local_b0;
  int local_ac;
  REF_INT local_a8;
  REF_INT local_a4;
  int local_a0;
  REF_INT local_9c;
  REF_INT local_98;
  int local_94;
  int local_90;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_DBL xyz [3];
  int local_58;
  int local_54;
  REF_INT face_geom;
  REF_INT edge_geom;
  REF_INT node_geom;
  REF_BOOL have_geom_face;
  REF_BOOL have_geom_edge;
  REF_BOOL have_geom_node;
  REF_INT geom;
  REF_INT item;
  REF_ADJ ref_adj;
  REF_GEOM ref_geom;
  REF_NODE ref_node;
  REF_INT node_local;
  REF_GRID ref_grid_local;
  
  pRVar2 = ref_grid->node;
  ref_geom_00 = ref_grid->geom;
  pRVar3 = ref_geom_00->ref_adj;
  if ((node < 0) || (pRVar3->nnode <= node)) {
    local_90 = -1;
  }
  else {
    local_90 = pRVar3->first[node];
  }
  if (local_90 == -1) {
    ref_grid_local._4_4_ = 0;
  }
  else if (ref_geom_00->meshlink == (void *)0x0) {
    bVar4 = false;
    face_geom = -1;
    if ((node < 0) || (pRVar3->nnode <= node)) {
      local_94 = -1;
    }
    else {
      local_94 = pRVar3->first[node];
    }
    have_geom_node = local_94;
    if (local_94 == -1) {
      local_98 = -1;
    }
    else {
      local_98 = pRVar3->item[local_94].ref;
    }
    have_geom_edge = local_98;
    while (have_geom_node != -1) {
      if (ref_geom_00->descr[have_geom_edge * 6] == 0) {
        bVar4 = true;
        face_geom = have_geom_edge;
        break;
      }
      have_geom_node = pRVar3->item[have_geom_node].next;
      if (have_geom_node == -1) {
        local_9c = -1;
      }
      else {
        local_9c = pRVar3->item[have_geom_node].ref;
      }
      have_geom_edge = local_9c;
    }
    if (bVar4) {
      ref_grid_local._4_4_ =
           ref_egads_eval(ref_geom_00,face_geom,(REF_DBL *)&ref_private_macro_code_rss_1,
                          (REF_DBL *)0x0);
      if (ref_grid_local._4_4_ == 0) {
        iVar1 = ref_geom_00->descr[face_geom * 6 + 5];
        pRVar2->real[iVar1 * 0xf] = _ref_private_macro_code_rss_1;
        pRVar2->real[iVar1 * 0xf + 1] = xyz[0];
        pRVar2->real[iVar1 * 0xf + 2] = xyz[1];
        ref_grid_local._4_4_ = 0;
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
               0x623,"ref_geom_constrain",(ulong)ref_grid_local._4_4_,"eval edge");
      }
    }
    else {
      bVar4 = false;
      local_54 = -1;
      if ((node < 0) || (pRVar3->nnode <= node)) {
        local_a0 = -1;
      }
      else {
        local_a0 = pRVar3->first[node];
      }
      have_geom_node = local_a0;
      if (local_a0 == -1) {
        local_a4 = -1;
      }
      else {
        local_a4 = pRVar3->item[local_a0].ref;
      }
      have_geom_edge = local_a4;
      while (have_geom_node != -1) {
        if (ref_geom_00->descr[have_geom_edge * 6] == 1) {
          bVar4 = true;
          local_54 = have_geom_edge;
          break;
        }
        have_geom_node = pRVar3->item[have_geom_node].next;
        if (have_geom_node == -1) {
          local_a8 = -1;
        }
        else {
          local_a8 = pRVar3->item[have_geom_node].ref;
        }
        have_geom_edge = local_a8;
      }
      if (bVar4) {
        ref_grid_local._4_4_ =
             ref_egads_eval(ref_geom_00,local_54,(REF_DBL *)&ref_private_macro_code_rss_1,
                            (REF_DBL *)0x0);
        if (ref_grid_local._4_4_ == 0) {
          iVar1 = ref_geom_00->descr[local_54 * 6 + 5];
          pRVar2->real[iVar1 * 0xf] = _ref_private_macro_code_rss_1;
          pRVar2->real[iVar1 * 0xf + 1] = xyz[0];
          pRVar2->real[iVar1 * 0xf + 2] = xyz[1];
          ref_grid_local._4_4_ = ref_geom_eval_edge_face_uv(ref_grid,local_54);
          if (ref_grid_local._4_4_ == 0) {
            ref_grid_local._4_4_ = 0;
          }
          else {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                   0x63c,"ref_geom_constrain",(ulong)ref_grid_local._4_4_,"resol edge uv");
          }
        }
        else {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                 0x637,"ref_geom_constrain",(ulong)ref_grid_local._4_4_,"eval edge");
        }
      }
      else {
        bVar4 = false;
        local_58 = -1;
        if ((node < 0) || (pRVar3->nnode <= node)) {
          local_ac = -1;
        }
        else {
          local_ac = pRVar3->first[node];
        }
        have_geom_node = local_ac;
        if (local_ac == -1) {
          local_b0 = -1;
        }
        else {
          local_b0 = pRVar3->item[local_ac].ref;
        }
        have_geom_edge = local_b0;
        while (have_geom_node != -1) {
          if (ref_geom_00->descr[have_geom_edge * 6] == 2) {
            bVar4 = true;
            local_58 = have_geom_edge;
            break;
          }
          have_geom_node = pRVar3->item[have_geom_node].next;
          if (have_geom_node == -1) {
            local_b4 = -1;
          }
          else {
            local_b4 = pRVar3->item[have_geom_node].ref;
          }
          have_geom_edge = local_b4;
        }
        if (bVar4) {
          ref_grid_local._4_4_ =
               ref_egads_eval(ref_geom_00,local_58,(REF_DBL *)&ref_private_macro_code_rss_1,
                              (REF_DBL *)0x0);
          if (ref_grid_local._4_4_ == 0) {
            iVar1 = ref_geom_00->descr[local_58 * 6 + 5];
            pRVar2->real[iVar1 * 0xf] = _ref_private_macro_code_rss_1;
            pRVar2->real[iVar1 * 0xf + 1] = xyz[0];
            pRVar2->real[iVar1 * 0xf + 2] = xyz[1];
            ref_grid_local._4_4_ = 0;
          }
          else {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                   0x64d,"ref_geom_constrain",(ulong)ref_grid_local._4_4_,"eval face");
          }
        }
        else {
          ref_grid_local._4_4_ = 0;
        }
      }
    }
  }
  else {
    ref_grid_local._4_4_ = ref_meshlink_constrain(ref_grid,node);
    if (ref_grid_local._4_4_ == 0) {
      ref_grid_local._4_4_ = 0;
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0x614,
             "ref_geom_constrain",(ulong)ref_grid_local._4_4_,"meshlink");
    }
  }
  return ref_grid_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_geom_constrain(REF_GRID ref_grid, REF_INT node) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_GEOM ref_geom = ref_grid_geom(ref_grid);
  REF_ADJ ref_adj = ref_geom_adj(ref_geom);
  REF_INT item, geom;
  REF_BOOL have_geom_node;
  REF_BOOL have_geom_edge;
  REF_BOOL have_geom_face;
  REF_INT node_geom;
  REF_INT edge_geom;
  REF_INT face_geom;
  REF_DBL xyz[3];

  /* no geom, do nothing */
  if (ref_adj_empty(ref_adj, node)) return REF_SUCCESS;

  if (ref_geom_meshlinked(ref_geom)) {
    RSS(ref_meshlink_constrain(ref_grid, node), "meshlink");
    return REF_SUCCESS;
  }

  have_geom_node = REF_FALSE;
  node_geom = REF_EMPTY;
  each_ref_adj_node_item_with_ref(ref_adj, node, item, geom) {
    if (REF_GEOM_NODE == ref_geom_type(ref_geom, geom)) {
      have_geom_node = REF_TRUE;
      node_geom = geom;
      break;
    }
  }

  if (have_geom_node) { /* update T of edges? update UV of (degen) faces? */
    RSS(ref_egads_eval(ref_geom, node_geom, xyz, NULL), "eval edge");
    node = ref_geom_node(ref_geom, node_geom);
    ref_node_xyz(ref_node, 0, node) = xyz[0];
    ref_node_xyz(ref_node, 1, node) = xyz[1];
    ref_node_xyz(ref_node, 2, node) = xyz[2];
    return REF_SUCCESS;
  }

  have_geom_edge = REF_FALSE;
  edge_geom = REF_EMPTY;
  each_ref_adj_node_item_with_ref(ref_adj, node, item, geom) {
    if (REF_GEOM_EDGE == ref_geom_type(ref_geom, geom)) {
      have_geom_edge = REF_TRUE;
      edge_geom = geom;
      break;
    }
  }

  /* edge geom, evaluate edge and update face uv */
  if (have_geom_edge) {
    RSS(ref_egads_eval(ref_geom, edge_geom, xyz, NULL), "eval edge");
    node = ref_geom_node(ref_geom, edge_geom);
    ref_node_xyz(ref_node, 0, node) = xyz[0];
    ref_node_xyz(ref_node, 1, node) = xyz[1];
    ref_node_xyz(ref_node, 2, node) = xyz[2];
    RSS(ref_geom_eval_edge_face_uv(ref_grid, edge_geom), "resol edge uv");
    return REF_SUCCESS;
  }

  /* look for face geom */
  have_geom_face = REF_FALSE;
  face_geom = REF_EMPTY;
  each_ref_adj_node_item_with_ref(ref_adj, node, item, geom) {
    if (REF_GEOM_FACE == ref_geom_type(ref_geom, geom)) {
      have_geom_face = REF_TRUE;
      face_geom = geom;
      break;
    }
  }

  /* face geom, evaluate on face uv */
  if (have_geom_face) {
    RSS(ref_egads_eval(ref_geom, face_geom, xyz, NULL), "eval face");
    node = ref_geom_node(ref_geom, face_geom);
    ref_node_xyz(ref_node, 0, node) = xyz[0];
    ref_node_xyz(ref_node, 1, node) = xyz[1];
    ref_node_xyz(ref_node, 2, node) = xyz[2];
    return REF_SUCCESS;
  }

  return REF_SUCCESS;
}